

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaDemuxer.cpp
# Opt level: O3

int __thiscall METADemuxer::readPacket(METADemuxer *this,AVPacket *avPacket)

{
  long lVar1;
  ContainerToReaderWrapper *this_00;
  _func_int **pp_Var2;
  int iVar3;
  int iVar4;
  ssize_t sVar5;
  undefined8 in_RCX;
  ulong __nbytes;
  size_t sVar6;
  pointer pSVar7;
  void *__buf;
  iterator __begin4;
  AVPacket *pAVar8;
  ulong uVar9;
  long lVar10;
  iterator __end4;
  pointer pSVar11;
  long lVar12;
  
  lVar10 = 0x7fffffffffffffff;
  avPacket->codec = (BaseAbstractStreamReader *)0x0;
  avPacket->data = (uint8_t *)0x0;
  avPacket->size = 0;
  avPacket->stream_index = 0;
  this->m_lastReadRez = 0;
  __nbytes = CONCAT71((int7)((ulong)in_RCX >> 8),1);
  __buf = (void *)0xffffffff;
  pAVar8 = avPacket;
LAB_001a1f2b:
  pSVar7 = (this->m_codecInfo).super__Vector_base<StreamInfo,_std::allocator<StreamInfo>_>._M_impl.
           super__Vector_impl_data._M_start;
  pSVar11 = (this->m_codecInfo).super__Vector_base<StreamInfo,_std::allocator<StreamInfo>_>._M_impl.
            super__Vector_impl_data._M_finish;
  sVar6 = __nbytes;
  if (0 < (int)((ulong)((long)pSVar11 - (long)pSVar7) >> 4) * -0xf0f0f0f) {
    lVar12 = 0;
    uVar9 = 0;
    do {
      if (this->m_flushDataMode == false) {
        sVar6 = __nbytes & 0xffffffff;
        sVar5 = StreamInfo::read((StreamInfo *)((long)&pSVar7->m_dataReader + lVar12),(int)pAVar8,
                                 __buf,__nbytes);
        iVar3 = (int)sVar5;
        *(int *)((long)&pSVar7->lastReadRez + lVar12) = iVar3;
        if (iVar3 == 3) {
          lVar1 = *(long *)((long)&pSVar7->m_lastDTS + lVar12);
          if ((lVar1 < lVar10) && ((&pSVar7->m_flushed)[lVar12] == false)) {
            __buf = (void *)(uVar9 & 0xffffffff);
            lVar10 = lVar1;
          }
        }
        else {
          if (iVar3 == 4) goto LAB_001a1ff3;
          if (iVar3 == 2) {
            this->m_lastReadRez = 2;
            return 2;
          }
          lVar1 = *(long *)((long)&pSVar7->m_lastDTS + lVar12);
          if (lVar1 < lVar10) {
            __buf = (void *)(uVar9 & 0xffffffff);
            lVar10 = lVar1;
          }
        }
        sVar6 = 0;
      }
      else {
        lVar1 = *(long *)((long)&pSVar7->m_lastDTS + lVar12);
        if ((lVar1 < lVar10) && ((&pSVar7->m_flushed)[lVar12] == false)) {
          __buf = (void *)(uVar9 & 0xffffffff);
          lVar10 = lVar1;
        }
        sVar6 = 0;
      }
LAB_001a1ff3:
      uVar9 = uVar9 + 1;
      pSVar7 = (this->m_codecInfo).super__Vector_base<StreamInfo,_std::allocator<StreamInfo>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pSVar11 = (this->m_codecInfo).super__Vector_base<StreamInfo,_std::allocator<StreamInfo>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      lVar12 = lVar12 + 0x110;
      __nbytes = sVar6;
    } while ((long)uVar9 < (long)((int)((ulong)((long)pSVar11 - (long)pSVar7) >> 4) * -0xf0f0f0f));
  }
  iVar3 = (int)__buf;
  __nbytes = sVar6;
  if ((sVar6 & 1) != 0) goto code_r0x001a2032;
  goto LAB_001a206a;
code_r0x001a2032:
  __nbytes = sVar6 & 0xffffffff;
  for (; pSVar7 != pSVar11; pSVar7 = pSVar7 + 1) {
    this_00 = (ContainerToReaderWrapper *)pSVar7->m_dataReader;
    if ((this_00 != (ContainerToReaderWrapper *)0x0) &&
       ((this_00->super_AbstractReader)._vptr_AbstractReader ==
        (_func_int **)&PTR__ContainerToReaderWrapper_0023e278)) {
      ContainerToReaderWrapper::resetDelayedMark(this_00);
    }
  }
  if ((sVar6 & 1) == 0) {
LAB_001a206a:
    if (iVar3 != -1) {
      pSVar7 = (this->m_codecInfo).super__Vector_base<StreamInfo,_std::allocator<StreamInfo>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (this->m_flushDataMode == false) {
        pp_Var2 = ((pSVar7[iVar3].m_streamReader)->super_BaseAbstractStreamReader).
                  _vptr_BaseAbstractStreamReader;
        if (pSVar7[iVar3].lastReadRez == 3) {
          (*pp_Var2[7])();
          pSVar7 = (this->m_codecInfo).super__Vector_base<StreamInfo,_std::allocator<StreamInfo>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pSVar7[iVar3].m_flushed = true;
        }
        else {
          iVar4 = (*pp_Var2[6])(pSVar7[iVar3].m_streamReader,avPacket);
          pSVar7 = (this->m_codecInfo).super__Vector_base<StreamInfo,_std::allocator<StreamInfo>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pSVar7[iVar3].m_lastAVRez = iVar4;
        }
        lVar10 = pSVar7[iVar3].m_timeShift;
        lVar12 = avPacket->dts + lVar10;
        avPacket->dts = lVar12;
        avPacket->pts = avPacket->pts + lVar10;
        pSVar7[iVar3].m_lastDTS = lVar12 + avPacket->duration;
      }
      else {
        (*((pSVar7[iVar3].m_streamReader)->super_BaseAbstractStreamReader).
          _vptr_BaseAbstractStreamReader[7])(pSVar7[iVar3].m_streamReader,avPacket);
        (this->m_codecInfo).super__Vector_base<StreamInfo,_std::allocator<StreamInfo>_>._M_impl.
        super__Vector_impl_data._M_start[iVar3].m_flushed = true;
      }
      updateReport(this,true);
      return 0;
    }
    if (this->m_flushDataMode != false) {
      updateReport(this,false);
      this->m_lastReadRez = 1;
      return 1;
    }
    this->m_flushDataMode = true;
    __buf = (void *)0xffffffff;
    lVar10 = 0x7fffffffffffffff;
    __nbytes = CONCAT71((int7)(__nbytes >> 8),1);
  }
  goto LAB_001a1f2b;
}

Assistant:

int METADemuxer::readPacket(AVPacket& avPacket)

{
    avPacket.stream_index = 0;
    avPacket.data = nullptr;
    avPacket.size = 0;
    avPacket.codec = nullptr;
    m_lastReadRez = 0;
    while (true)
    {
        int minDtsIndex = -1;
        int64_t minDts = LLONG_MAX;
        bool allDataDelayed = true;
        while (allDataDelayed)
        {
            for (int i = 0; i < static_cast<int>(m_codecInfo.size()); i++)
            {
                StreamInfo& streamInfo = m_codecInfo[i];
                if (!m_flushDataMode)
                {
                    streamInfo.lastReadRez = streamInfo.read();
                    if (streamInfo.lastReadRez == BufferedFileReader::DATA_DELAYED)
                        continue;  // skip stream
                    allDataDelayed = false;
                    if (streamInfo.lastReadRez == BufferedFileReader::DATA_NOT_READY)
                    {
                        m_lastReadRez = BufferedFileReader::DATA_NOT_READY;
                        return BufferedFileReader::DATA_NOT_READY;
                    }
                    if (streamInfo.lastReadRez != BufferedFileReader::DATA_EOF2)
                    {
                        if (streamInfo.m_lastDTS < minDts)
                        {
                            minDtsIndex = i;
                            minDts = streamInfo.m_lastDTS;
                        }
                    }
                    else if (streamInfo.m_lastDTS < minDts && !streamInfo.m_flushed)
                    {
                        minDtsIndex = i;
                        minDts = streamInfo.m_lastDTS;
                    }
                }
                else
                {
                    allDataDelayed = false;
                    if (streamInfo.m_lastDTS < minDts && !streamInfo.m_flushed)
                    {
                        minDtsIndex = i;
                        minDts = streamInfo.m_lastDTS;
                    }
                }
            }
            if (allDataDelayed)
                for (const StreamInfo& si : m_codecInfo)
                {
                    const auto cReader = dynamic_cast<ContainerToReaderWrapper*>(si.m_dataReader);
                    if (cReader)
                        cReader->resetDelayedMark();
                }
        }
        if (minDtsIndex != -1)
        {
            if (!m_flushDataMode)
            {
                if (m_codecInfo[minDtsIndex].lastReadRez != BufferedFileReader::DATA_EOF2)
                {
                    const int res = m_codecInfo[minDtsIndex].m_streamReader->readPacket(avPacket);
                    m_codecInfo[minDtsIndex].m_lastAVRez = res;
                }
                else
                {
                    // flush single stream
                    m_codecInfo[minDtsIndex].m_streamReader->flushPacket(avPacket);
                    m_codecInfo[minDtsIndex].m_flushed = true;
                }
                // add time shift from external sync source
                // add static time shift
                avPacket.dts += m_codecInfo[minDtsIndex].m_timeShift;
                avPacket.pts += m_codecInfo[minDtsIndex].m_timeShift;
                m_codecInfo[minDtsIndex].m_lastDTS = avPacket.dts + avPacket.duration;
            }
            else
            {  // flush all streams
                m_codecInfo[minDtsIndex].m_streamReader->flushPacket(avPacket);
                m_codecInfo[minDtsIndex].m_flushed = true;
            }
            updateReport(true);
            return 0;
        }
        if (!m_flushDataMode)
            m_flushDataMode = true;
        else
        {
            updateReport(false);
            m_lastReadRez = BufferedFileReader::DATA_EOF;
            return BufferedReader::DATA_EOF;
        }
    }
}